

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsCreatePropertyString(char *name,size_t length,JsValueRef *propertyString)

{
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  undefined4 *puVar4;
  PropertyString *pPVar5;
  AutoNestedHandledExceptionType local_58 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,false);
  if (JVar3 == JsNoError) {
    this = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
           ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (this->TTDShouldPerformRecordAction == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                         ,0x3b5,"(false)","Need to implement support here!!!");
      if (!bVar2) goto LAB_003c5fe7;
      *puVar4 = 0;
    }
    JVar3 = JsCreatePropertyId(name,length,&anon_var_0.m_staticAbortMessage);
    if (JVar3 == JsNoError) {
      pPVar5 = Js::ScriptContext::GetPropertyString
                         (this,(PropertyRecord *)anon_var_0.m_staticAbortMessage);
      *propertyString = pPVar5;
    }
    else if ((((JVar3 - JsErrorNoCurrentContext < 7) &&
              ((0x43U >> (JVar3 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
             (JVar3 == JsErrorOutOfMemory)) ||
            ((JVar3 == JsErrorFatal || ((JVar3 & 0xfffffffd) == JsErrorScriptException)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                         ,0x11f,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
LAB_003c5fe7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsCreatePropertyString(
    _In_z_ const char *name,
    _In_ size_t length,
    _Out_ JsValueRef *propertyString)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        Js::PropertyRecord* propertyRecord;
        JsErrorCode errorCode = JsCreatePropertyId(name, length, (JsPropertyIdRef *)&propertyRecord);

        if (errorCode != JsNoError)
        {
            return errorCode;
        }

        *propertyString = scriptContext->GetPropertyString(propertyRecord);
        return JsNoError;
    });
}